

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

Expr str_insert(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args
               ,int argc)

{
  _Bool _Var1;
  size_t index;
  pString value;
  anon_union_8_8_707b72ea_for_Expr_1 str;
  char *__s;
  Expr EVar3;
  Expr EVar4;
  Expr expr;
  Expr expr_00;
  Expr ptr;
  Expr ptr_00;
  Expr expr_01;
  Expr ptr_01;
  Expr expr_02;
  Expr expr_03;
  anon_union_8_8_707b72ea_for_Expr_1 aVar2;
  
  hlp_check_args_count(argc,3,3,"__str-insert");
  EVar3._4_4_ = 0;
  EVar3.type = args->type;
  EVar3.field_1.val_atom = (args->field_1).val_atom;
  EVar3 = exec_eval(exec,callContext,EVar3);
  ptr._4_4_ = 0;
  ptr.type = EVar3.type;
  ptr.field_1.val_atom = EVar3.field_1.val_atom;
  EVar3 = dereference(ptr);
  str = EVar3.field_1;
  expr._4_4_ = 0;
  expr.type = args[1].type;
  expr.field_1.val_atom = args[1].field_1.val_atom;
  EVar3 = exec_eval(exec,callContext,expr);
  ptr_00._4_4_ = 0;
  ptr_00.type = EVar3.type;
  ptr_00.field_1.val_atom = EVar3.field_1.val_atom;
  EVar3 = dereference(ptr_00);
  index = longint_to_long(EVar3.field_1.val_int);
  expr_00._4_4_ = 0;
  expr_00.type = args[2].type;
  expr_00.field_1.val_atom = args[2].field_1.val_atom;
  EVar3 = exec_eval(exec,callContext,expr_00);
  aVar2 = EVar3.field_1;
  expr_01._4_4_ = 0;
  expr_01.type = EVar3.type;
  expr_01.field_1.val_atom = aVar2.val_atom;
  _Var1 = is_string(expr_01);
  ptr_01._0_8_ = CONCAT44(0,EVar3.type);
  if (_Var1) {
    ptr_01.field_1.val_atom = aVar2.val_atom;
    EVar3 = dereference(ptr_01);
    value = string_insert(str.val_str,index,EVar3.field_1.val_str);
  }
  else {
    expr_02.field_1.val_atom = aVar2.val_atom;
    expr_02._0_8_ = ptr_01._0_8_;
    _Var1 = is_char(expr_02);
    if (!_Var1) {
      __s = "__str-insert: third argument not a string or char";
      goto LAB_00105b14;
    }
    value = string_insert_char(str.val_str,index,EVar3.field_1._0_1_);
  }
  if ((pString)str.val_atom == (pString)0x0) {
    __s = "__str-insert: string_insert failed";
  }
  else {
    EVar3 = make_string(exec,value);
    EVar4.field_1 = EVar3.field_1;
    EVar4.type = EVar3.type;
    free_string(value);
    expr_03._4_4_ = 0;
    expr_03.type = EVar4.type;
    expr_03.field_1.val_atom = EVar4.field_1.val_atom;
    _Var1 = is_none(expr_03);
    if (!_Var1) {
      EVar4._4_4_ = 0;
      return EVar4;
    }
    __s = "__str-insert: make_string failed";
  }
LAB_00105b14:
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_insert)
{
    hlp_check_args_count(argc, 3, 3, "__str-insert");

    pString str = dereference(EVAL_ARG(0)).val_str;
    size_t index = (size_t) longint_to_long(dereference(EVAL_ARG(1)).val_int);
    Expr arg_sub = EVAL_ARG(2);

    pString res_str;
    if (is_string(arg_sub))
        res_str = string_insert(str, index, dereference(arg_sub).val_str);
    else if (is_char(arg_sub))
        res_str = string_insert_char(str, index, arg_sub.val_char);
    else
    {
        log("__str-insert: third argument not a string or char");
        exit(1);
    }
    if (str == NULL)
    {
        log("__str-insert: string_insert failed");
        exit(1);
    }

    Expr res = make_string(exec, res_str);
    free_string(res_str);
    if (is_none(res))
    {
        log("__str-insert: make_string failed");
        exit(1);
    }
    return res;
}